

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegenerator.h
# Opt level: O1

void __thiscall CodeGenerator::generate(CodeGenerator *this)

{
  _Rb_tree_header *p_Var1;
  size_type *psVar2;
  _Base_ptr p_Var3;
  bool bVar4;
  size_type *local_58;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>
  i;
  
  p_Var3 = (this->m_classes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->m_classes)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var1) {
    psVar2 = &i.first._M_string_length;
    bVar4 = false;
    do {
      local_58 = psVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,*(long *)(p_Var3 + 1),
                 (long)&(p_Var3[1]._M_parent)->_M_color + *(long *)(p_Var3 + 1));
      i.first.field_2._8_8_ = *(undefined8 *)(p_Var3 + 2);
      if (((Class *)i.first.field_2._8_8_)->declarationOnly == false) {
        bVar4 = true;
        generateClass(this,(Class *)i.first.field_2._8_8_);
      }
      if (local_58 != psVar2) {
        operator_delete(local_58);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var1);
    if (bVar4) {
      return;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"No class definitions present in input. Nothing generated",0x38);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  return;
}

Assistant:

void CodeGenerator::generate()
{
    bool atLeastOne = false;
    for (auto i : m_classes) {
        if (!i.second->declarationOnly) {
            atLeastOne = true;
            generateClass(i.second);
        }
    }
    if (!atLeastOne) {
        std::cerr << "No class definitions present in input. Nothing generated" << std::endl;
        return;
    }
}